

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.c
# Opt level: O3

void DataTable_transfer(DataTable *to_data_table,DataTable *from_data_table)

{
  int iVar1;
  
  iVar1 = (from_data_table->location).line;
  to_data_table->type = from_data_table->type;
  (to_data_table->location).line = iVar1;
  (to_data_table->location).column = (from_data_table->location).column;
  to_data_table->rows = from_data_table->rows;
  from_data_table->rows = (TableRows *)0x0;
  DataTable_delete(from_data_table);
  return;
}

Assistant:

void DataTable_transfer(DataTable* to_data_table, DataTable* from_data_table) {
    to_data_table->type = from_data_table->type;
    to_data_table->location.line = from_data_table->location.line;
    to_data_table->location.column = from_data_table->location.column;
    to_data_table->rows = from_data_table->rows;
    from_data_table->rows = 0;
    DataTable_delete(from_data_table);
}